

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O2

void matras_touch_reserve_test(void)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  char *pcVar5;
  undefined8 uVar6;
  int i_1;
  int i;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  undefined1 local_d0 [8];
  matras mat;
  matras_view empty_view;
  matras_view view;
  matras_id_t id;
  
  _space(_stdout);
  printf("# *** %s ***\n","matras_touch_reserve_test");
  plan(0xe);
  matras_create((matras *)local_d0,0x10,&pta_allocator,(matras_stats *)0x0);
  matras_create_read_view((matras *)local_d0,(matras_view *)&mat.stats);
  uVar8 = 0xffffffffffffffff;
  do {
    pvVar4 = matras_alloc((matras *)local_d0,(matras_id_t *)((long)&view.next_view + 4));
    if (uVar8 == 0xff) {
      iVar7 = 0;
      _ok((uint)(pvVar4 == (void *)0x0),"matras_alloc(&mat, &id) == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x195
          ,"line %d",0x195);
      _ok((uint)(view.next_view._4_4_ == 0xff),"id == max_capacity - 1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x196
          ,"line %d",0x196);
      sVar1 = AllocatedCount;
      matras_touch_reserve((matras *)local_d0,0);
      _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19b
          ,"line %d",0x19b);
      matras_touch_reserve((matras *)local_d0,1);
      _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19d
          ,"line %d",0x19d);
      matras_touch_reserve((matras *)local_d0,0x80);
      _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x19f
          ,"line %d",0x19f);
      matras_touch_reserve((matras *)local_d0,0x100);
      _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a1
          ,"line %d",0x1a1);
      matras_destroy_read_view((matras *)local_d0,(matras_view *)&mat.stats);
      sVar1 = AllocatedCount;
      matras_touch_reserve((matras *)local_d0,0);
      _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a7
          ,"line %d",0x1a7);
      matras_touch_reserve((matras *)local_d0,1);
      _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1a9
          ,"line %d",0x1a9);
      matras_touch_reserve((matras *)local_d0,0x80);
      _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ab
          ,"line %d",0x1ab);
      matras_touch_reserve((matras *)local_d0,0x100);
      _ok((uint)(AllocatedCount == sVar1),"AllocatedCount == extents_in_use_before_reserve",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ad
          ,"line %d",0x1ad);
      matras_create_read_view((matras *)local_d0,(matras_view *)&empty_view.next_view);
      sVar1 = AllocatedCount;
      matras_touch_reserve((matras *)local_d0,2);
      _ok((uint)(AllocatedCount == sVar1 + 5),"AllocatedCount == extents_in_use_before_reserve + 5",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1b6
          ,"line %d",0x1b6);
      matras_touch((matras *)local_d0,0);
      matras_touch((matras *)local_d0,view.next_view._4_4_);
      _ok((uint)(AllocatedCount == sVar1 + 5),"AllocatedCount == extents_in_use_before_reserve + 5",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1ba
          ,"line %d",0x1ba);
      matras_destroy_read_view((matras *)local_d0,(matras_view *)&empty_view.next_view);
      matras_create_read_view((matras *)local_d0,(matras_view *)&empty_view.next_view);
      matras_touch((matras *)local_d0,view.next_view._4_4_ >> 1);
      sVar1 = AllocatedCount;
      matras_touch_reserve((matras *)local_d0,2);
      _ok((uint)(AllocatedCount == sVar1 + 4),"AllocatedCount == extents_in_use_before_reserve + 4",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1c7
          ,"line %d",0x1c7);
      matras_touch((matras *)local_d0,0);
      matras_touch((matras *)local_d0,view.next_view._4_4_);
      _ok((uint)(AllocatedCount == sVar1 + 4),"AllocatedCount == extents_in_use_before_reserve + 4",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x1cb
          ,"line %d",0x1cb);
      goto LAB_00104d2d;
    }
    if (pvVar4 == (void *)0x0) {
      pcVar5 = "data != NULL";
      uVar6 = 0x192;
      goto LAB_00104ece;
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 == view.next_view._4_4_);
  pcVar5 = "id == i";
  uVar6 = 0x193;
  goto LAB_00104ece;
  while( true ) {
    uVar2 = rand();
    uVar2 = uVar2 & 0xff;
    matras_touch_reserve((matras *)local_d0,uVar2);
    sVar1 = AllocatedCount;
    while (bVar9 = uVar2 != 0, uVar2 = uVar2 - 1, bVar9) {
      uVar3 = rand();
      matras_touch((matras *)local_d0,uVar3 & 0xff);
    }
    iVar7 = iVar7 + 1;
    if (AllocatedCount != sVar1) break;
LAB_00104d2d:
    if (iVar7 == 10000) {
      iVar7 = 0;
      do {
        matras_destroy_read_view((matras *)local_d0,(matras_view *)&empty_view.next_view);
        if (iVar7 == 10000) {
          matras_destroy((matras *)local_d0);
          _space(_stdout);
          printf("# *** %s: done ***\n","matras_touch_reserve_test");
          check_plan();
          return;
        }
        matras_create_read_view((matras *)local_d0,(matras_view *)&empty_view.next_view);
        uVar2 = rand();
        uVar2 = uVar2 & 0xff;
        matras_touch_reserve((matras *)local_d0,uVar2);
        sVar1 = AllocatedCount;
        while (bVar9 = uVar2 != 0, uVar2 = uVar2 - 1, bVar9) {
          uVar3 = rand();
          matras_touch((matras *)local_d0,uVar3 & 0xff);
        }
        iVar7 = iVar7 + 1;
      } while (AllocatedCount == sVar1);
      pcVar5 = "AllocatedCount == extents_in_use_after_reserve";
      uVar6 = 0x1e4;
      goto LAB_00104ece;
    }
  }
  pcVar5 = "AllocatedCount == extents_in_use_after_reserve";
  uVar6 = 0x1d5;
LAB_00104ece:
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar5,"false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",uVar6
          ,"matras_touch_reserve_test");
  exit(-1);
}

Assistant:

void
matras_touch_reserve_test()
{
	header();
	plan(14);

	int random_test_count = 10000;
	size_t extents_in_use_before_reserve;

	size_t max_capacity = PROV_EXTENT_SIZE / PROV_BLOCK_SIZE;
	max_capacity *= PROV_EXTENT_SIZE / sizeof(void *);
	max_capacity *= PROV_EXTENT_SIZE / sizeof(void *);

	matras_id_t id;
	struct matras mat;
	matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);

	/* Create an empty matras view. */
	struct matras_view empty_view;
	matras_create_read_view(&mat, &empty_view);

	/* Fill the actual matras. */
	for (size_t i = 0; i < max_capacity; i++) {
		void *data = matras_alloc(&mat, &id);
		fail_unless(data != NULL);
		fail_unless(id == i);
	}
	is(matras_alloc(&mat, &id), NULL);
	is(id, max_capacity - 1);

	/* Nothing reserved with an empty view. */
	extents_in_use_before_reserve = AllocatedCount;
	matras_touch_reserve(&mat, 0);
	is(AllocatedCount, extents_in_use_before_reserve);
	matras_touch_reserve(&mat, 1);
	is(AllocatedCount, extents_in_use_before_reserve);
	matras_touch_reserve(&mat, max_capacity / 2);
	is(AllocatedCount, extents_in_use_before_reserve);
	matras_touch_reserve(&mat, max_capacity);
	is(AllocatedCount, extents_in_use_before_reserve);

	/* Nothing reserved with no view. */
	matras_destroy_read_view(&mat, &empty_view);
	extents_in_use_before_reserve = AllocatedCount;
	matras_touch_reserve(&mat, 0);
	is(AllocatedCount, extents_in_use_before_reserve);
	matras_touch_reserve(&mat, 1);
	is(AllocatedCount, extents_in_use_before_reserve);
	matras_touch_reserve(&mat, max_capacity / 2);
	is(AllocatedCount, extents_in_use_before_reserve);
	matras_touch_reserve(&mat, max_capacity);
	is(AllocatedCount, extents_in_use_before_reserve);

	/* Create a filled read view. */
	struct matras_view view;
	matras_create_read_view(&mat, &view);

	/* Reserve and touch first and last blocks. */
	extents_in_use_before_reserve = AllocatedCount;
	matras_touch_reserve(&mat, 2);
	is(AllocatedCount, extents_in_use_before_reserve + 5);
	matras_touch(&mat, 0);
	matras_touch(&mat, id);
	/* Used reserved blocks, no new allocations. */
	is(AllocatedCount, extents_in_use_before_reserve + 5);

	/* Recreate the read view. */
	matras_destroy_read_view(&mat, &view);
	matras_create_read_view(&mat, &view);

	/*
	 * Reserve and touch first and last
	 * blocks after the root is copied.
	 */
	matras_touch(&mat, id / 2);
	extents_in_use_before_reserve = AllocatedCount;
	matras_touch_reserve(&mat, 2);
	is(AllocatedCount, extents_in_use_before_reserve + 4);
	matras_touch(&mat, 0);
	matras_touch(&mat, id);
	/* Used reserved blocks, no new allocations. */
	is(AllocatedCount, extents_in_use_before_reserve + 4);

	/* Reserve and touch random blocks. */
	for (int i = 0; i < random_test_count; i++) {
		int touch_count = rand() % max_capacity;
		matras_touch_reserve(&mat, touch_count);
		size_t extents_in_use_after_reserve = AllocatedCount;
		for (int j = 0; j < touch_count; j++)
			matras_touch(&mat, rand() % max_capacity);
		/* Used reserved blocks, no new allocations. */
		fail_unless(AllocatedCount == extents_in_use_after_reserve);
	}

	/* Reserve and touch random blocks with new read view. */
	for (int i = 0; i < random_test_count; i++) {
		/* Recreate the read view. */
		matras_destroy_read_view(&mat, &view);
		matras_create_read_view(&mat, &view);

		int touch_count = rand() % max_capacity;
		matras_touch_reserve(&mat, touch_count);
		size_t extents_in_use_after_reserve = AllocatedCount;
		for (int j = 0; j < touch_count; j++)
			matras_touch(&mat, rand() % max_capacity);
		/* Used reserved blocks, no new allocations. */
		fail_unless(AllocatedCount == extents_in_use_after_reserve);
	}

	/* Clean-up. */
	matras_destroy_read_view(&mat, &view);
	matras_destroy(&mat);

	footer();
	check_plan();
}